

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bezier_arc.cpp
# Opt level: O0

void agg::arc_to_bezier(double cx,double cy,double rx,double ry,double start_angle,
                       double sweep_angle,double *curve)

{
  double dVar1;
  double dVar2;
  uint local_bc;
  uint i;
  double cs;
  double sn;
  double py [4];
  double px [4];
  double ty;
  double tx;
  double y0;
  double x0;
  double *curve_local;
  double sweep_angle_local;
  double start_angle_local;
  double ry_local;
  double rx_local;
  double cy_local;
  double cx_local;
  
  dVar1 = cos(sweep_angle / 2.0);
  py[2] = sin(sweep_angle / 2.0);
  py[1] = py[2] - ((((1.0 - dVar1) * 4.0) / 3.0) * dVar1) / py[2];
  py[0] = -py[1];
  py[3] = dVar1;
  dVar1 = sin(start_angle + sweep_angle / 2.0);
  dVar2 = cos(start_angle + sweep_angle / 2.0);
  for (local_bc = 0; local_bc < 4; local_bc = local_bc + 1) {
    curve[local_bc << 1] =
         rx * (py[(ulong)local_bc + 3] * dVar2 + -(py[(ulong)local_bc - 1] * dVar1)) + cx;
    curve[local_bc * 2 + 1] =
         ry * (py[(ulong)local_bc + 3] * dVar1 + py[(ulong)local_bc - 1] * dVar2) + cy;
  }
  return;
}

Assistant:

void arc_to_bezier(double cx, double cy, double rx, double ry, 
                       double start_angle, double sweep_angle,
                       double* curve)
    {
        double x0 = cos(sweep_angle / 2.0);
        double y0 = sin(sweep_angle / 2.0);
        double tx = (1.0 - x0) * 4.0 / 3.0;
        double ty = y0 - tx * x0 / y0;
        double px[4];
        double py[4];
        px[0] =  x0;
        py[0] = -y0;
        px[1] =  x0 + tx;
        py[1] = -ty;
        px[2] =  x0 + tx;
        py[2] =  ty;
        px[3] =  x0;
        py[3] =  y0;

        double sn = sin(start_angle + sweep_angle / 2.0);
        double cs = cos(start_angle + sweep_angle / 2.0);

        unsigned i;
        for(i = 0; i < 4; i++)
        {
            curve[i * 2]     = cx + rx * (px[i] * cs - py[i] * sn);
            curve[i * 2 + 1] = cy + ry * (px[i] * sn + py[i] * cs);
        }
    }